

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_dextp_mips64el(target_ulong ac,target_ulong size,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  ulong local_48;
  uint64_t temp;
  uint64_t tempA;
  uint64_t tempB;
  int sub;
  int len;
  int start_pos;
  CPUMIPSState_conflict5 *env_local;
  target_ulong size_local;
  target_ulong ac_local;
  
  local_48 = 0;
  uVar3 = get_DSPControl_pos(env);
  cVar2 = (char)(size & 0x3f);
  bVar1 = (char)uVar3 - cVar2;
  if ((int)(uVar3 - ((int)(size & 0x3f) + 1)) < -1) {
    set_DSPControl_efi(1,env);
  }
  else {
    local_48 = ((env->active_tc).HI[ac] << (0x40 - bVar1 & 0x3f) |
               (env->active_tc).LO[ac] >> (bVar1 & 0x3f)) & (1L << (cVar2 + 1U & 0x3f)) - 1U;
    set_DSPControl_efi(0,env);
  }
  return local_48;
}

Assistant:

target_ulong helper_dextp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int start_pos;
    int len;
    int sub;
    uint64_t tempB, tempA;
    uint64_t temp;

    temp = 0;

    size = size & 0x3F;
    start_pos = get_DSPControl_pos(env);
    len = start_pos - size;
    tempB = env->active_tc.HI[ac];
    tempA = env->active_tc.LO[ac];

    sub = start_pos - (size + 1);

    if (sub >= -1) {
        temp = (tempB << (64 - len)) | (tempA >> len);
        temp = temp & ((1ULL << (size + 1)) - 1);
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return temp;
}